

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O2

HighsInt Highs_changeColsIntegralityByMask(void *highs,HighsInt *mask,HighsInt *integrality)

{
  HighsStatus HVar1;
  HighsInt iCol;
  size_type sVar2;
  size_type __new_size;
  vector<HighsVarType,_std::allocator<HighsVarType>_> pass_integrality;
  _Vector_base<HighsVarType,_std::allocator<HighsVarType>_> local_38;
  
  __new_size = (size_type)*(int *)((long)highs + 0x138);
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_start = (HighsVarType *)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (0 < (long)__new_size) {
    std::vector<HighsVarType,_std::allocator<HighsVarType>_>::resize
              ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)&local_38,__new_size);
    for (sVar2 = 0; __new_size != sVar2; sVar2 = sVar2 + 1) {
      local_38._M_impl.super__Vector_impl_data._M_start[sVar2] =
           *(HighsVarType *)(integrality + sVar2);
    }
  }
  HVar1 = Highs::changeColsIntegrality
                    ((Highs *)highs,mask,local_38._M_impl.super__Vector_impl_data._M_start);
  std::_Vector_base<HighsVarType,_std::allocator<HighsVarType>_>::~_Vector_base(&local_38);
  return HVar1;
}

Assistant:

HighsInt Highs_changeColsIntegralityByMask(void* highs, const HighsInt* mask,
                                           const HighsInt* integrality) {
  const HighsInt num__col = Highs_getNumCol(highs);
  vector<HighsVarType> pass_integrality;
  if (num__col > 0) {
    pass_integrality.resize(num__col);
    for (HighsInt iCol = 0; iCol < num__col; iCol++) {
      pass_integrality[iCol] = (HighsVarType)integrality[iCol];
    }
  }
  return (HighsInt)((Highs*)highs)
      ->changeColsIntegrality(mask, pass_integrality.data());
}